

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O1

void mat4_get_axes(mat4 m,vec3 *x,vec3 *y,vec3 *z)

{
  x->x = m.m[0];
  x->y = m.m[1];
  x->z = m.m[2];
  y->x = m.m[4];
  y->y = m.m[5];
  y->z = m.m[6];
  z->x = m.m[8];
  z->y = m.m[9];
  z->z = m.m[10];
  return;
}

Assistant:

void mat4_get_axes(mat4 m, vec3 *x, vec3 *y, vec3 *z) {
    x->x = m.m[0];
    x->y = m.m[1];
    x->z = m.m[2];

    y->x = m.m[4];
    y->y = m.m[5];
    y->z = m.m[6];

    z->x = m.m[8];
    z->y = m.m[9];
    z->z = m.m[10];
}